

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

void __thiscall
SmallArray<FunctionValue,_1U>::grow(SmallArray<FunctionValue,_1U> *this,uint newSize)

{
  undefined4 *puVar1;
  undefined4 *puVar2;
  FunctionValue *pFVar3;
  uint count;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  FunctionValue *pFVar7;
  long lVar8;
  uint i;
  uint uVar9;
  ulong uVar10;
  
  uVar9 = (this->max >> 1) + this->max;
  count = newSize + 4;
  if (newSize < uVar9) {
    count = uVar9;
  }
  if (this->allocator == (Allocator *)0x0) {
    pFVar7 = NULLC::construct<FunctionValue>(count);
  }
  else {
    pFVar7 = Allocator::construct<FunctionValue>(this->allocator,count);
  }
  lVar8 = 0;
  uVar10 = 0;
  while( true ) {
    pFVar3 = this->data;
    if (this->count <= uVar10) break;
    *(undefined8 *)((long)&pFVar7->context + lVar8) =
         *(undefined8 *)((long)&pFVar3->context + lVar8);
    puVar1 = (undefined4 *)((long)&pFVar3->source + lVar8);
    uVar4 = puVar1[1];
    uVar5 = puVar1[2];
    uVar6 = puVar1[3];
    puVar2 = (undefined4 *)((long)&pFVar7->source + lVar8);
    *puVar2 = *puVar1;
    puVar2[1] = uVar4;
    puVar2[2] = uVar5;
    puVar2[3] = uVar6;
    uVar10 = uVar10 + 1;
    lVar8 = lVar8 + 0x18;
  }
  if (pFVar3 != this->little) {
    if (this->allocator == (Allocator *)0x0) {
      if (pFVar3 != (FunctionValue *)0x0) {
        (*(code *)NULLC::dealloc)(pFVar3);
      }
    }
    else if (pFVar3 != (FunctionValue *)0x0) {
      (*this->allocator->_vptr_Allocator[3])();
    }
  }
  this->data = pFVar7;
  this->max = count;
  return;
}

Assistant:

void grow(unsigned newSize)
	{
		if(max + (max >> 1) > newSize)
			newSize = max + (max >> 1);
		else
			newSize += 4;

		T* newData = 0;
		
		if(allocator)
			newData = allocator->construct<T>(newSize);
		else
			newData = NULLC::construct<T>(newSize);

		for(unsigned i = 0; i < count; i++)
			newData[i] = data[i];

		if(data != little)
		{
			if(allocator)
				allocator->destruct(data, max);
			else
				NULLC::destruct(data, max);
		}

		data = newData;

		max = newSize;
	}